

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_from_bytes(uchar *bytes,size_t bytes_len,uint32_t flags,wally_tx **output)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  uchar *local_2a0;
  uchar *local_288;
  uchar *local_278;
  uchar *local_260;
  uchar *local_250;
  uchar *local_238;
  uchar *local_220;
  uchar *local_208;
  uchar *local_1f8;
  uchar *local_1e0;
  uchar *local_1a8;
  size_t local_190;
  uint64_t rangeproof_len;
  uint64_t surjectionproof_len;
  uchar *rangeproof;
  uchar *surjectionproof;
  uint64_t offset;
  uint64_t inflation_keys_rangeproof_len;
  uint64_t issuance_amount_rangeproof_len;
  uchar *inflation_keys_rangeproof;
  uchar *issuance_amount_rangeproof;
  uint64_t witness_len;
  uint64_t nonce_len;
  uint64_t value_len;
  uint64_t asset_len;
  uint64_t script_len_1;
  uint64_t satoshi;
  uchar *nonce_1;
  uchar *value;
  uchar *asset;
  uchar *script_1;
  uint64_t inflation_keys_len;
  uint64_t issuance_amount_len;
  uint64_t script_len;
  uint32_t sequence;
  uint32_t index;
  uchar *inflation_keys;
  uchar *issuance_amount;
  uchar *entropy;
  uchar *nonce;
  uchar *script;
  uchar *txhash;
  wally_tx *result;
  size_t sStack_98;
  int ret;
  uint64_t num_witnesses;
  uint64_t tmp;
  size_t num_outputs;
  size_t num_inputs;
  size_t j;
  size_t i;
  _Bool expect_witnesses;
  uchar *puStack_60;
  _Bool is_elements;
  uchar *p;
  wally_tx **output_local;
  size_t sStack_48;
  uint32_t flags_local;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  i._7_1_ = (flags & 2) != 0;
  if (output == (wally_tx **)0x0) {
    bytes_local._4_4_ = -2;
  }
  else {
    *output = (wally_tx *)0x0;
    puStack_60 = bytes;
    p = (uchar *)output;
    output_local._4_4_ = flags;
    sStack_48 = bytes_len;
    bytes_len_local = (size_t)bytes;
    iVar2 = analyze_tx(bytes,bytes_len,flags,&num_outputs,&tmp,(_Bool *)((long)&i + 6));
    if (iVar2 == 0) {
      result._4_4_ = wally_tx_init_alloc(0,0,num_outputs,tmp,(wally_tx **)p);
      bytes_local._4_4_ = result._4_4_;
      if (result._4_4_ == 0) {
        txhash = *(uchar **)p;
        sVar4 = uint32_from_le_bytes(puStack_60,(uint32_t *)txhash);
        puStack_60 = puStack_60 + sVar4;
        if ((i._7_1_ & 1) == 0) {
          if ((i._6_1_ & 1) != 0) {
            puStack_60 = puStack_60 + 2;
          }
        }
        else {
          puStack_60 = puStack_60 + 1;
        }
        sVar4 = varint_from_bytes(puStack_60,&num_witnesses);
        puStack_60 = puStack_60 + sVar4;
        for (j = 0; j < num_outputs; j = j + 1) {
          script = puStack_60;
          entropy = (uchar *)0x0;
          issuance_amount = (uchar *)0x0;
          inflation_keys = (uchar *)0x0;
          _sequence = (uchar *)0x0;
          inflation_keys_len = 0;
          script_1 = (uchar *)0x0;
          puStack_60 = puStack_60 + 0x20;
          sVar4 = uint32_from_le_bytes(puStack_60,(uint32_t *)((long)&script_len + 4));
          puStack_60 = puStack_60 + sVar4;
          sVar4 = varint_from_bytes(puStack_60,&issuance_amount_len);
          nonce = puStack_60 + sVar4;
          puStack_60 = nonce + issuance_amount_len;
          sVar4 = uint32_from_le_bytes(puStack_60,(uint32_t *)&script_len);
          puStack_60 = puStack_60 + sVar4;
          if ((((i._7_1_ & 1) != 0) && ((script_len._4_4_ & 0x80000000) != 0)) &&
             (_Var1 = is_coinbase_bytes(script,0x20,script_len._4_4_), !_Var1)) {
            entropy = puStack_60;
            issuance_amount = puStack_60 + 0x20;
            inflation_keys = puStack_60 + 0x40;
            puStack_60 = inflation_keys;
            sVar4 = confidential_value_varint_from_bytes(inflation_keys,&inflation_keys_len);
            _sequence = puStack_60 + sVar4;
            puStack_60 = _sequence;
            sVar4 = confidential_value_varint_from_bytes(_sequence,(uint64_t *)&script_1);
            puStack_60 = puStack_60 + sVar4;
          }
          if (issuance_amount_len == 0) {
            local_1a8 = (uchar *)0x0;
          }
          else {
            local_1a8 = nonce;
          }
          iVar2 = 0;
          if (entropy != (uchar *)0x0) {
            iVar2 = 0x20;
          }
          iVar3 = 0;
          if (issuance_amount != (uchar *)0x0) {
            iVar3 = 0x20;
          }
          if (inflation_keys_len == 0) {
            local_1e0 = (uchar *)0x0;
          }
          else {
            local_1e0 = inflation_keys;
          }
          if (script_1 == (uchar *)0x0) {
            local_1f8 = (uchar *)0x0;
          }
          else {
            local_1f8 = _sequence;
          }
          result._4_4_ = tx_elements_input_init
                                   (script,0x20,script_len._4_4_,(uint32_t)script_len,local_1a8,
                                    issuance_amount_len,(wally_tx_witness_stack *)0x0,entropy,
                                    (long)iVar2,issuance_amount,(long)iVar3,local_1e0,
                                    inflation_keys_len,local_1f8,(size_t)script_1,(uchar *)0x0,0,
                                    (uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                                    (wally_tx_input *)(*(long *)(txhash + 8) + j * 0xd0),
                                    (_Bool)(i._7_1_ & 1));
          if (result._4_4_ != 0) goto LAB_00108ecf;
          *(long *)(txhash + 0x10) = *(long *)(txhash + 0x10) + 1;
          result._4_4_ = 0;
        }
        sVar4 = varint_from_bytes(puStack_60,&num_witnesses);
        puStack_60 = puStack_60 + sVar4;
        for (j = 0; j < tmp; j = j + 1) {
          value = (uchar *)0x0;
          nonce_1 = (uchar *)0x0;
          satoshi = 0;
          script_len_1 = 0xffffffffffffffff;
          value_len = 0;
          nonce_len = 0;
          witness_len = 0;
          if ((i._7_1_ & 1) == 0) {
            sVar4 = uint64_from_le_bytes(puStack_60,&script_len_1);
            puStack_60 = puStack_60 + sVar4;
          }
          else {
            value = puStack_60;
            sVar4 = confidential_asset_varint_from_bytes(puStack_60,&value_len);
            nonce_1 = puStack_60 + sVar4;
            puStack_60 = nonce_1;
            sVar4 = confidential_value_varint_from_bytes(nonce_1,&nonce_len);
            satoshi = (uint64_t)(puStack_60 + sVar4);
            puStack_60 = (uchar *)satoshi;
            sVar4 = confidential_nonce_varint_from_bytes((uchar *)satoshi,&witness_len);
            puStack_60 = puStack_60 + sVar4;
          }
          sVar4 = varint_from_bytes(puStack_60,&asset_len);
          asset = puStack_60 + sVar4;
          puStack_60 = asset + asset_len;
          local_208 = asset;
          if (asset_len == 0) {
            local_208 = (uchar *)0x0;
          }
          if (value_len == 0) {
            local_220 = (uchar *)0x0;
          }
          else {
            local_220 = value;
          }
          if (nonce_len == 0) {
            local_238 = (uchar *)0x0;
          }
          else {
            local_238 = nonce_1;
          }
          if (witness_len == 0) {
            local_250 = (uchar *)0x0;
          }
          else {
            local_250 = (uchar *)satoshi;
          }
          result._4_4_ = tx_elements_output_init
                                   (script_len_1,local_208,asset_len,local_220,value_len,local_238,
                                    nonce_len,local_250,witness_len,(uchar *)0x0,0,(uchar *)0x0,0,
                                    (wally_tx_output *)(*(long *)(txhash + 0x20) + j * 0x70),
                                    (_Bool)(i._7_1_ & 1));
          if (result._4_4_ != 0) goto LAB_00108ecf;
          *(long *)(txhash + 0x28) = *(long *)(txhash + 0x28) + 1;
          result._4_4_ = 0;
        }
        if (((i._6_1_ & 1) != 0) && ((i._7_1_ & 1) == 0)) {
          for (j = 0; j < num_outputs; j = j + 1) {
            sVar4 = varint_from_bytes(puStack_60,&stack0xffffffffffffff68);
            puStack_60 = puStack_60 + sVar4;
            if (sStack_98 != 0) {
              result._4_4_ = wally_tx_witness_stack_init_alloc
                                       (sStack_98,
                                        (wally_tx_witness_stack **)
                                        (*(long *)(txhash + 8) + j * 0xd0 + 0x38));
              if (result._4_4_ != 0) goto LAB_00108ecf;
              for (num_inputs = 0; result._4_4_ = 0, num_inputs < sStack_98;
                  num_inputs = num_inputs + 1) {
                sVar4 = varint_from_bytes(puStack_60,(uint64_t *)&issuance_amount_rangeproof);
                puStack_60 = puStack_60 + sVar4;
                result._4_4_ = wally_tx_witness_stack_set
                                         (*(wally_tx_witness_stack **)
                                           (*(long *)(txhash + 8) + j * 0xd0 + 0x38),num_inputs,
                                          puStack_60,(size_t)issuance_amount_rangeproof);
                if (result._4_4_ != 0) goto LAB_00108ecf;
                puStack_60 = issuance_amount_rangeproof + (long)puStack_60;
              }
            }
          }
        }
        uint32_from_le_bytes(puStack_60,(uint32_t *)(txhash + 4));
        if (((i._6_1_ & 1) != 0) && ((i._7_1_ & 1) != 0)) {
          puStack_60 = puStack_60 + 4;
          for (j = 0; j < num_outputs; j = j + 1) {
            sVar4 = varint_from_bytes(puStack_60,&inflation_keys_rangeproof_len);
            inflation_keys_rangeproof = puStack_60 + sVar4;
            puStack_60 = inflation_keys_rangeproof + inflation_keys_rangeproof_len;
            sVar4 = varint_from_bytes(puStack_60,&offset);
            issuance_amount_rangeproof_len = (uint64_t)(puStack_60 + sVar4);
            puStack_60 = (uchar *)(issuance_amount_rangeproof_len + offset);
            if (inflation_keys_rangeproof_len == 0) {
              local_260 = (uchar *)0x0;
            }
            else {
              local_260 = inflation_keys_rangeproof;
            }
            local_278 = (uchar *)issuance_amount_rangeproof_len;
            if (offset == 0) {
              local_278 = (uchar *)0x0;
            }
            result._4_4_ = tx_elements_input_issuance_proof_init
                                     ((wally_tx_input *)(*(long *)(txhash + 8) + j * 0xd0),local_260
                                      ,inflation_keys_rangeproof_len,local_278,offset);
            if ((result._4_4_ != 0) ||
               (result._4_4_ = witness_stack_from_bytes
                                         (puStack_60,
                                          (wally_tx_witness_stack **)
                                          (*(long *)(txhash + 8) + j * 0xd0 + 0x38),
                                          (uint64_t *)&surjectionproof), result._4_4_ != 0))
            goto LAB_00108ecf;
            puStack_60 = surjectionproof + (long)puStack_60;
            result._4_4_ = witness_stack_from_bytes
                                     (puStack_60,
                                      (wally_tx_witness_stack **)
                                      (*(long *)(txhash + 8) + j * 0xd0 + 200),
                                      (uint64_t *)&surjectionproof);
            if (result._4_4_ != 0) goto LAB_00108ecf;
            puStack_60 = surjectionproof + (long)puStack_60;
            result._4_4_ = 0;
          }
          for (j = 0; j < tmp; j = j + 1) {
            sVar4 = varint_from_bytes(puStack_60,&rangeproof_len);
            rangeproof = puStack_60 + sVar4;
            puStack_60 = rangeproof + rangeproof_len;
            sVar4 = varint_from_bytes(puStack_60,&local_190);
            surjectionproof_len = (uint64_t)(puStack_60 + sVar4);
            puStack_60 = (uchar *)(surjectionproof_len + local_190);
            if (rangeproof_len == 0) {
              local_288 = (uchar *)0x0;
            }
            else {
              local_288 = rangeproof;
            }
            local_2a0 = (uchar *)surjectionproof_len;
            if (local_190 == 0) {
              local_2a0 = (uchar *)0x0;
            }
            result._4_4_ = tx_elements_output_proof_init
                                     ((wally_tx_output *)(*(long *)(txhash + 0x20) + j * 0x70),
                                      local_288,rangeproof_len,local_2a0,local_190);
            if (result._4_4_ != 0) {
LAB_00108ecf:
              tx_free((wally_tx *)txhash,true);
              p[0] = '\0';
              p[1] = '\0';
              p[2] = '\0';
              p[3] = '\0';
              p[4] = '\0';
              p[5] = '\0';
              p[6] = '\0';
              p[7] = '\0';
              return result._4_4_;
            }
            result._4_4_ = 0;
          }
        }
        bytes_local._4_4_ = 0;
      }
    }
    else {
      bytes_local._4_4_ = -2;
    }
  }
  return bytes_local._4_4_;
}

Assistant:

static int tx_from_bytes(const unsigned char *bytes, size_t bytes_len,
                         uint32_t flags, struct wally_tx **output)
{
    const unsigned char *p = bytes;
    const bool is_elements = flags & WALLY_TX_FLAG_USE_ELEMENTS;
    bool expect_witnesses;
    size_t i, j, num_inputs, num_outputs;
    uint64_t tmp, num_witnesses;
    int ret;
    struct wally_tx *result;

    TX_CHECK_OUTPUT;

    if (analyze_tx(bytes, bytes_len, flags, &num_inputs, &num_outputs,
                   &expect_witnesses) != WALLY_OK)
        return WALLY_EINVAL;

    ret = wally_tx_init_alloc(0, 0, num_inputs, num_outputs, output);
    if (ret != WALLY_OK)
        return ret;
    result = (struct wally_tx *)*output;

    p += uint32_from_le_bytes(p, &result->version);
    if (is_elements)
        p++; /* Skip witness flag */
    else if (expect_witnesses)
        p += 2; /* Skip flag bytes */
    p += varint_from_bytes(p, &tmp);

    for (i = 0; i < num_inputs; ++i) {
        const unsigned char *txhash = p, *script, *nonce = NULL, *entropy = NULL;
        const unsigned char *issuance_amount = NULL, *inflation_keys = NULL;
        uint32_t index, sequence;
        uint64_t script_len, issuance_amount_len = 0, inflation_keys_len = 0;
        p += WALLY_TXHASH_LEN;
        p += uint32_from_le_bytes(p, &index);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        p += uint32_from_le_bytes(p, &sequence);
        if (is_elements && !!(index & WALLY_TX_ISSUANCE_FLAG) && !is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, index)) {
            nonce = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            entropy = p;
            p += WALLY_TX_ASSET_TAG_LEN;
            issuance_amount = p;
            p += confidential_value_varint_from_bytes(p, &issuance_amount_len);
            inflation_keys = p;
            p += confidential_value_varint_from_bytes(p, &inflation_keys_len);
        }
        ret = tx_elements_input_init(txhash, WALLY_TXHASH_LEN, index, sequence,
                                     script_len ? script : NULL, script_len, NULL,
                                     nonce, nonce ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     entropy, entropy ? WALLY_TX_ASSET_TAG_LEN : 0,
                                     issuance_amount_len ? issuance_amount : NULL, issuance_amount_len,
                                     inflation_keys_len ? inflation_keys : NULL, inflation_keys_len,
                                     NULL, 0, NULL, 0, NULL, &result->inputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_inputs += 1;
    }

    p += varint_from_bytes(p, &tmp);
    for (i = 0; i < num_outputs; ++i) {
        const unsigned char *script, *asset = NULL, *value = NULL, *nonce = NULL;
        uint64_t satoshi = -1, script_len, asset_len = 0, value_len = 0, nonce_len = 0;
        if (is_elements) {
            asset = p;
            p += confidential_asset_varint_from_bytes(p, &asset_len);
            value = p;
            p += confidential_value_varint_from_bytes(p, &value_len);
            nonce = p;
            p += confidential_nonce_varint_from_bytes(p, &nonce_len);
        } else
            p += uint64_from_le_bytes(p, &satoshi);
        p += varint_from_bytes(p, &script_len);
        script = p;
        p += script_len;
        ret = tx_elements_output_init(satoshi, script_len ? script : NULL, script_len,
                                      asset_len ? asset : NULL, asset_len,
                                      value_len ? value : NULL, value_len,
                                      nonce_len ? nonce : NULL, nonce_len,
                                      NULL, 0, NULL, 0,
                                      &result->outputs[i], is_elements);
        if (ret != WALLY_OK)
            goto fail;
        result->num_outputs += 1;
    }

    if (expect_witnesses && !is_elements) {
        for (i = 0; i < num_inputs; ++i) {
            p += varint_from_bytes(p, &num_witnesses);
            if (!num_witnesses)
                continue;
            ret = wally_tx_witness_stack_init_alloc(num_witnesses,
                                                    &result->inputs[i].witness);
            if (ret != WALLY_OK)
                goto fail;

            for (j = 0; j < num_witnesses; ++j) {
                uint64_t witness_len;
                p += varint_from_bytes(p, &witness_len);
                ret = wally_tx_witness_stack_set(result->inputs[i].witness, j,
                                                 p, witness_len);
                if (ret != WALLY_OK)
                    goto fail;
                p += witness_len;
            }
        }
    }

    uint32_from_le_bytes(p, &result->locktime);

#ifdef BUILD_ELEMENTS

#define proof_from_bytes(dst, len) \
    p += varint_from_bytes(p, (len)); \
    (dst) = p; \
    p += *(len)

    if (expect_witnesses && is_elements) {
        p += sizeof(uint32_t);
        for (i = 0; i < num_inputs; ++i) {
            const unsigned char *issuance_amount_rangeproof, *inflation_keys_rangeproof;
            uint64_t issuance_amount_rangeproof_len, inflation_keys_rangeproof_len, offset;
            proof_from_bytes(issuance_amount_rangeproof, &issuance_amount_rangeproof_len);
            proof_from_bytes(inflation_keys_rangeproof, &inflation_keys_rangeproof_len);
            ret = tx_elements_input_issuance_proof_init(result->inputs + i,
                                                        issuance_amount_rangeproof_len ? issuance_amount_rangeproof : NULL,
                                                        issuance_amount_rangeproof_len,
                                                        inflation_keys_rangeproof_len ? inflation_keys_rangeproof : NULL,
                                                        inflation_keys_rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
            ret = witness_stack_from_bytes(p, &result->inputs[i].witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
            ret = witness_stack_from_bytes(p, &result->inputs[i].pegin_witness, &offset);
            if (ret != WALLY_OK)
                goto fail;
            p += offset;
        }

        for (i = 0; i < num_outputs; ++i) {
            const unsigned char *surjectionproof, *rangeproof;
            uint64_t surjectionproof_len, rangeproof_len;
            proof_from_bytes(surjectionproof, &surjectionproof_len);
            proof_from_bytes(rangeproof, &rangeproof_len);
            ret = tx_elements_output_proof_init(result->outputs + i,
                                                surjectionproof_len ? surjectionproof : NULL,
                                                surjectionproof_len,
                                                rangeproof_len ? rangeproof : NULL,
                                                rangeproof_len);
            if (ret != WALLY_OK)
                goto fail;
        }
    }

#undef proof_from_bytes

#endif /* BUILD_ELEMENTS */
    return WALLY_OK;
fail:
    tx_free(result, true);
    *output = NULL;
    return ret;
}